

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3JournalOpen(sqlite3_vfs *pVfs,char *zName,sqlite3_file *pJfd,int flags,int nSpill)

{
  MemJournal *p;
  int nSpill_local;
  int flags_local;
  sqlite3_file *pJfd_local;
  char *zName_local;
  sqlite3_vfs *pVfs_local;
  
  memset(pJfd,0,0x58);
  if (nSpill == 0) {
    pVfs_local._4_4_ = sqlite3OsOpen(pVfs,zName,pJfd,flags,(int *)0x0);
  }
  else {
    if (nSpill < 1) {
      *(undefined4 *)&pJfd[1].pMethods = 0x3f8;
    }
    else {
      *(int *)&pJfd[1].pMethods = nSpill;
    }
    pJfd->pMethods = &MemJournalMethods;
    *(int *)((long)&pJfd[1].pMethods + 4) = nSpill;
    *(int *)&pJfd[8].pMethods = flags;
    pJfd[10].pMethods = (sqlite3_io_methods *)zName;
    pJfd[9].pMethods = (sqlite3_io_methods *)pVfs;
    pVfs_local._4_4_ = 0;
  }
  return pVfs_local._4_4_;
}

Assistant:

SQLITE_PRIVATE int sqlite3JournalOpen(
  sqlite3_vfs *pVfs,         /* The VFS to use for actual file I/O */
  const char *zName,         /* Name of the journal file */
  sqlite3_file *pJfd,        /* Preallocated, blank file handle */
  int flags,                 /* Opening flags */
  int nSpill                 /* Bytes buffered before opening the file */
){
  MemJournal *p = (MemJournal*)pJfd;

  /* Zero the file-handle object. If nSpill was passed zero, initialize
  ** it using the sqlite3OsOpen() function of the underlying VFS. In this
  ** case none of the code in this module is executed as a result of calls
  ** made on the journal file-handle.  */
  memset(p, 0, sizeof(MemJournal));
  if( nSpill==0 ){
    return sqlite3OsOpen(pVfs, zName, pJfd, flags, 0);
  }

  if( nSpill>0 ){
    p->nChunkSize = nSpill;
  }else{
    p->nChunkSize = 8 + MEMJOURNAL_DFLT_FILECHUNKSIZE - sizeof(FileChunk);
    assert( MEMJOURNAL_DFLT_FILECHUNKSIZE==fileChunkSize(p->nChunkSize) );
  }

  p->pMethod = (const sqlite3_io_methods*)&MemJournalMethods;
  p->nSpill = nSpill;
  p->flags = flags;
  p->zJournal = zName;
  p->pVfs = pVfs;
  return SQLITE_OK;
}